

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O2

double __thiscall Alg::max_cover_lazy(Alg *this,int targetSize,int mode)

{
  pointer pvVar1;
  size_t sVar2;
  pointer puVar3;
  pointer pvVar4;
  size_type *psVar5;
  size_type __n;
  pointer pvVar6;
  uint *puVar7;
  uint uVar8;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint *puVar13;
  ostream *poVar14;
  pointer *ppuVar15;
  size_type __n_00;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  size_type *psVar21;
  bool bVar22;
  bool bVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  reference rVar27;
  ulong local_120;
  value_type argmaxIdx;
  value_type currDegBound;
  int local_104;
  RRsets degMap;
  undefined8 local_e8;
  long local_d0;
  Nodelist vecBound;
  FRset coverage;
  vector<bool,_std::allocator<bool>_> edgeMark;
  uint uVar9;
  
  this->__boundLast = 1.79769313486232e+308;
  this->__boundMin = 1.79769313486232e+308;
  edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_104 = mode;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&coverage,(ulong)this->__numV,(value_type_conflict2 *)&edgeMark,
             (allocator_type *)&degMap);
  uVar11 = (ulong)this->__numV;
  ppuVar15 = (pointer *)
             ((long)&(this->__hyperG)._FRsets.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar11 - 1].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data + 8);
  local_120 = 0;
  while (bVar22 = uVar11 != 0, uVar11 = uVar11 - 1, bVar22) {
    uVar16 = (long)*ppuVar15 - (long)((_Vector_impl_data *)(ppuVar15 + -1))->_M_start >> 3;
    coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar11] = uVar16;
    if (local_120 < uVar16) {
      local_120 = uVar16;
    }
    ppuVar15 = ppuVar15 + -3;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&degMap,local_120 + 1,(allocator_type *)&edgeMark);
  uVar9 = this->__numV;
  while( true ) {
    uVar8 = uVar9 - 1;
    edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar8);
    if (uVar9 == 0) break;
    uVar9 = uVar8;
    if (coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (degMap.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8],(value_type_conflict *)&edgeMark);
      uVar9 = (uint)edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    }
  }
  vecBound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&edgeMark,this->__numRRsets,(bool *)&vecBound,(allocator_type *)&currDegBound);
  puVar3 = (this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  __n_00 = (size_type)targetSize;
  local_d0 = 0;
  do {
    if (local_120 == 0) {
LAB_00104995:
      if (local_120 == 0) {
        local_e8 = (double)this->__numV;
      }
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&edgeMark.super__Bvector_base<std::allocator<bool>_>);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&degMap);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return local_e8;
    }
    pvVar1 = degMap.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_120;
    local_e8 = (double)((long)degMap.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_120].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)degMap.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_120].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
    lVar19 = (long)local_e8 >> 2;
    while( true ) {
      local_e8 = (double)((long)local_e8 + -4);
      lVar18 = lVar19 + -1;
      if (lVar19 == 0) break;
      argmaxIdx = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar18];
      uVar11 = coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[argmaxIdx];
      if (uVar11 < local_120) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (degMap.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar11,&argmaxIdx);
        lVar19 = lVar18;
      }
      else {
        if ((local_104 == 2) ||
           ((local_104 == 1 &&
            ((long)(this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2 == __n_00)))) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&vecBound,__n_00,(allocator_type *)&currDegBound);
          lVar17 = 0;
          while( true ) {
            lVar20 = lVar19 + lVar17;
            lVar12 = __n_00 + lVar17;
            if (lVar12 == 0) break;
            if (lVar20 == 0) {
              lVar20 = -1;
              break;
            }
            *(int *)(CONCAT71(vecBound.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._1_7_,
                              vecBound.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_1_) + __n_00 * 4 + -4 +
                    lVar17 * 4) =
                 (int)coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [*(uint *)((long)degMap.
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[local_120].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                                lVar17 * 4 + (long)local_e8)];
            lVar17 = lVar17 + -1;
          }
          uVar16 = local_120;
          while (iVar10 = (int)lVar12, iVar10 != 0) {
            uVar16 = uVar16 - 1;
            if (uVar16 == 0) {
              uVar16 = 0;
              break;
            }
            puVar3 = degMap.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar19 = (long)degMap.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar16].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
            lVar12 = (long)iVar10;
            while ((lVar20 = lVar19, lVar12 != 0 &&
                   (bVar22 = lVar19 != 0, lVar19 = lVar19 + -1, lVar20 = -1, bVar22))) {
              *(int *)(CONCAT71(vecBound.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                vecBound.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_1_) + (lVar12 + -1) * 4)
                   = (int)coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[puVar3[lVar19]];
              lVar12 = lVar12 + -1;
            }
          }
          bVar22 = iVar10 == 0;
          make_min_heap(&vecBound);
          while ((bVar22 && (bVar23 = lVar20 != 0, lVar20 = lVar20 + -1, bVar23))) {
            currDegBound = coverage.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start
                           [degMap.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar16].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar20]];
            if (*(uint *)CONCAT71(vecBound.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                  vecBound.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_1_) < uVar16) {
              if (*(uint *)CONCAT71(vecBound.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._1_7_,
                                    vecBound.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_1_) < currDegBound)
              {
                min_heap_replace_min_value(&vecBound,&currDegBound);
              }
            }
            else {
              bVar22 = false;
            }
          }
          while ((bVar22 && (uVar16 = uVar16 - 1, uVar16 != 0))) {
            lVar19 = (long)degMap.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar16].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)degMap.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar16].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            while ((bVar22 && (bVar23 = lVar19 != 0, lVar19 = lVar19 + -1, bVar23))) {
              currDegBound = coverage.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start
                             [degMap.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar19]];
              if (*(uint *)CONCAT71(vecBound.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._1_7_,
                                    vecBound.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_1_) < uVar16) {
                if (*(uint *)CONCAT71(vecBound.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                      vecBound.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_1_) <
                    currDegBound) {
                  min_heap_replace_min_value(&vecBound,&currDegBound);
                }
              }
              else {
                bVar22 = false;
              }
            }
          }
          lVar19 = 0;
          for (puVar13 = (uint *)CONCAT71(vecBound.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                          vecBound.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start._0_1_);
              puVar13 !=
              vecBound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish; puVar13 = puVar13 + 1) {
            lVar19 = lVar19 + (ulong)*puVar13;
          }
          lVar19 = lVar19 + local_d0;
          auVar25._8_4_ = (int)((ulong)lVar19 >> 0x20);
          auVar25._0_8_ = lVar19;
          auVar25._12_4_ = 0x45300000;
          sVar2 = this->__numRRsets;
          auVar26._8_4_ = (int)(sVar2 >> 0x20);
          auVar26._0_8_ = sVar2;
          auVar26._12_4_ = 0x45300000;
          dVar24 = ((double)this->__numV *
                   ((auVar25._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0))) /
                   ((auVar26._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
          this->__boundLast = dVar24;
          if (dVar24 < this->__boundMin) {
            this->__boundMin = dVar24;
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&vecBound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        }
        if (__n_00 <= (ulong)((long)(this->__vecSeed).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->__vecSeed).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2)) {
          uVar9 = this->__numV;
          sVar2 = this->__numRRsets;
          std::operator<<((ostream *)&std::cout,"  >>>[greedy-lazy] influence: ");
          local_e8._0_4_ = (undefined4)sVar2;
          local_e8._4_4_ = (undefined4)(sVar2 >> 0x20);
          local_e8 = ((double)uVar9 *
                     (((double)CONCAT44(0x45300000,(int)((ulong)local_d0 >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_d0) - 4503599627370496.0))) /
                     (((double)CONCAT44(0x45300000,local_e8._4_4_) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(undefined4)local_e8) - 4503599627370496.0));
          poVar14 = std::ostream::_M_insert<double>(local_e8);
          std::operator<<(poVar14,", min-bound: ");
          poVar14 = std::ostream::_M_insert<double>(this->__boundMin);
          std::operator<<(poVar14,", last-bound: ");
          poVar14 = std::ostream::_M_insert<double>(this->__boundLast);
          std::operator<<(poVar14,'\n');
          goto LAB_00104995;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->__vecSeed,&argmaxIdx);
        local_d0 = local_d0 + uVar11;
        uVar11 = (ulong)argmaxIdx;
        coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11] = 0;
        pvVar4 = (this->__hyperG)._FRsets.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar5 = *(pointer *)
                  ((long)&pvVar4[uVar11].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (psVar21 = pvVar4[uVar11].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start; lVar19 = lVar18, psVar21 != psVar5;
            psVar21 = psVar21 + 1) {
          __n = *psVar21;
          rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[](&edgeMark,__n);
          if ((*rVar27._M_p & rVar27._M_mask) == 0) {
            rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[](&edgeMark,__n);
            *rVar27._M_p = *rVar27._M_p | rVar27._M_mask;
            pvVar6 = (this->__hyperG)._RRsets.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar7 = *(pointer *)
                      ((long)&pvVar6[__n].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + 8);
            for (puVar13 = pvVar6[__n].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start; puVar13 != puVar7;
                puVar13 = puVar13 + 1) {
              if (coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[*puVar13] != 0) {
                coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[*puVar13] =
                     coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[*puVar13] - 1;
              }
            }
          }
        }
      }
    }
    degMap.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         degMap.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&(degMap.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    local_120 = local_120 - 1;
  } while( true );
}

Assistant:

double Alg::max_cover_lazy(const int targetSize, const int mode)
{
    // mode: optimization mode.
    // 0->no optimization,
    // 1->optimization with the upper bound in the last round,
    // 2->optimization with minimum upper bound among all rounds [Default].
    __boundLast = DBL_MAX, __boundMin = DBL_MAX;
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;)
    {
        const auto deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) maxDeg = deg;
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;)
    {
        if (coverage[i] == 0) continue;
        degMap[coverage[i]].push_back(i);
    }
    size_t sumInf = 0;

    // check if an edge is removed
    std::vector<bool> edgeMark(__numRRsets, false);

    __vecSeed.clear();
    for (auto deg = maxDeg; deg > 0; deg--) // Enusre deg > 0
    {
        auto& vecNode = degMap[deg];
        for (auto idx = vecNode.size(); idx--;)
        {
            auto argmaxIdx = vecNode[idx];
            const auto currDeg = coverage[argmaxIdx];
            if (deg > currDeg)
            {
                degMap[currDeg].push_back(argmaxIdx);
                continue;
            }
            if (mode == 2 || (mode == 1 && __vecSeed.size() == targetSize))
            {
                // Find upper bound
                auto topk = targetSize;
                auto degBound = deg;
                Nodelist vecBound(targetSize);
                // Initialize vecBound
                auto idxBound = idx + 1;
                while (topk && idxBound--)
                {
                    vecBound[--topk] = coverage[degMap[degBound][idxBound]];
                }
                while (topk && --degBound)
                {
                    idxBound = degMap[degBound].size();
                    while (topk && idxBound--)
                    {
                        vecBound[--topk] = coverage[degMap[degBound][idxBound]];
                    }
                }
                make_min_heap(vecBound);

                // Find the top-k marginal coverage
                auto flag = topk == 0;
                while (flag && idxBound--)
                {
                    const auto currDegBound = coverage[degMap[degBound][idxBound]];
                    if (vecBound[0] >= degBound)
                    {
                        flag = false;
                    }
                    else if (vecBound[0] < currDegBound)
                    {
                        min_heap_replace_min_value(vecBound, currDegBound);
                    }
                }
                while (flag && --degBound)
                {
                    idxBound = degMap[degBound].size();
                    while (flag && idxBound--)
                    {
                        const auto currDegBound = coverage[degMap[degBound][idxBound]];
                        if (vecBound[0] >= degBound)
                        {
                            flag = false;
                        }
                        else if (vecBound[0] < currDegBound)
                        {
                            min_heap_replace_min_value(vecBound, currDegBound);
                        }
                    }
                }
                __boundLast = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0)) + sumInf) *
                        __numV / __numRRsets;
                if (__boundMin > __boundLast) __boundMin = __boundLast;
            }
            if (__vecSeed.size() >= targetSize)
            {
                // Top-k influential nodes constructed
                const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
                std::cout << "  >>>[greedy-lazy] influence: " << finalInf << ", min-bound: " << __boundMin <<
                          ", last-bound: " << __boundLast << '\n';
                return finalInf;
            }
            sumInf = sumInf + currDeg;
            __vecSeed.push_back(argmaxIdx);
            coverage[argmaxIdx] = 0;
            for (auto edgeIdx : __hyperG._FRsets[argmaxIdx])
            {
                if (edgeMark[edgeIdx]) continue;
                edgeMark[edgeIdx] = true;
                for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
                {
                    if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                    coverage[nodeIdx]--;
                }
            }
        }
        degMap.pop_back();
    }
    return 1.0 * __numV; // All RR sets are covered.
}